

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

EmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitBinExpr
          (WasmBytecodeGenerator *this,OpCodeAsmJs op,WasmType *signature)

{
  WasmType type;
  WasmType expectedType;
  EmitInfo EVar1;
  EmitInfo EVar2;
  WasmRegisterSpace *this_00;
  EmitInfo EVar3;
  undefined6 in_register_00000032;
  EmitInfo local_48;
  EmitInfo lhs;
  EmitInfo rhs;
  
  type = *signature;
  expectedType = signature[1];
  EVar1 = PopEvalStack(this,signature[2],(char16 *)0x0);
  lhs = EVar1;
  EVar2 = PopEvalStack(this,expectedType,(char16 *)0x0);
  local_48 = EVar2;
  ReleaseLocation(this,&lhs);
  ReleaseLocation(this,&local_48);
  this_00 = GetRegisterSpace(this,type);
  EVar3.super_EmitInfoBase.location = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x10])
            (this->m_writer,CONCAT62(in_register_00000032,op) & 0xffffffff,
             (ulong)EVar3.super_EmitInfoBase.location,(ulong)EVar2 & 0xffffffff,
             (ulong)EVar1 & 0xffffffff);
  EVar3.type = type;
  return EVar3;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitBinExpr(Js::OpCodeAsmJs op, const WasmTypes::WasmType* signature)
{
    WasmTypes::WasmType resultType = signature[0];
    WasmTypes::WasmType lhsType = signature[1];
    WasmTypes::WasmType rhsType = signature[2];

    EmitInfo rhs = PopEvalStack(rhsType);
    EmitInfo lhs = PopEvalStack(lhsType);

    ReleaseLocation(&rhs);
    ReleaseLocation(&lhs);

    Js::RegSlot resultReg = GetRegisterSpace(resultType)->AcquireTmpRegister();

    m_writer->AsmReg3(op, resultReg, lhs.location, rhs.location);

    return EmitInfo(resultReg, resultType);
}